

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O3

void __thiscall
bloaty::dwarf::CU::ReadHeader
          (CU *this,string_view entire_unit,string_view data,Section section,InfoReader *reader)

{
  CompilationUnitSizes *this_00;
  uint8_t address_size;
  uint16_t uVar1;
  uint64_t uVar2;
  mapped_type *this_01;
  CU *pCVar3;
  Nonnull<char_*> pcVar4;
  ulong uVar5;
  byte bVar6;
  Arg *a0;
  string_view data_00;
  string_view format;
  uint64_t debug_abbrev_offset;
  string_view local_88;
  uint64_t local_78;
  Nonnull<char_*> local_70;
  char local_68 [32];
  string local_48;
  
  a0 = (Arg *)data._M_str;
  uVar5 = data._M_len;
  (this->entire_unit_)._M_len = entire_unit._M_len;
  (this->entire_unit_)._M_str = entire_unit._M_str;
  this->dwarf_ = reader->dwarf_;
  this->dwo_id_ = 0;
  if (uVar5 < 2) goto LAB_001aa6db;
  this_00 = &this->unit_sizes_;
  uVar1 = (uint16_t)(a0->piece_)._M_len;
  local_88._M_str = (char *)((long)&(a0->piece_)._M_len + 2);
  local_88._M_len = uVar5 - 2;
  this_00->dwarf_version_ = uVar1;
  bVar6 = (byte)uVar1;
  if (5 < bVar6) {
    pcVar4 = absl::numbers_internal::FastIntToBuffer((uint)bVar6,local_68);
    local_78 = (long)pcVar4 - (long)local_68;
    format._M_str = (char *)&local_78;
    format._M_len = (size_t)"Data is in DWARF $0 format which we don\'t understand";
    local_70 = local_68;
    absl::Substitute_abi_cxx11_(&local_48,(absl *)0x34,format,a0);
    Throw(local_48._M_dataplus._M_p,0x88);
  }
  if (bVar6 == 5) {
    if ((local_88._M_len == 0) || (this->unit_type_ = *local_88._M_str, uVar5 == 3))
    goto LAB_001aa6db;
    local_88._M_str = (char *)((long)&(a0->piece_)._M_len + 4);
    local_88._M_len = uVar5 - 4;
    CompilationUnitSizes::SetAddressSize(this_00,*(uint8_t *)((long)&(a0->piece_)._M_len + 3));
    local_78 = CompilationUnitSizes::ReadDWARFOffset(this_00,&local_88);
    switch(this->unit_type_) {
    case '\x01':
    case '\x03':
      break;
    case '\x02':
      goto switchD_001aa5b4_caseD_2;
    case '\x04':
    case '\x05':
    case '\x06':
      if (local_88._M_len < 8) goto LAB_001aa6db;
      uVar2 = *(uint64_t *)local_88._M_str;
      local_88._M_str = (char *)((long)local_88._M_str + 8);
      local_88._M_len = local_88._M_len - 8;
      this->dwo_id_ = uVar2;
      break;
    default:
      ReadHeader();
    }
  }
  else {
    local_78 = CompilationUnitSizes::ReadDWARFOffset(this_00,&local_88);
    if (local_88._M_len == 0) goto LAB_001aa6db;
    address_size = *local_88._M_str;
    local_88._M_str = (char *)((long)local_88._M_str + 1);
    local_88._M_len = local_88._M_len - 1;
    CompilationUnitSizes::SetAddressSize(this_00,address_size);
    if (section != kDebugTypes) goto switchD_001aa5b4_caseD_1;
switchD_001aa5b4_caseD_2:
    if (local_88._M_len < 8) {
LAB_001aa6db:
      Throw("premature EOF reading fixed-length data",0x8d);
    }
    uVar2 = *(uint64_t *)local_88._M_str;
    local_88._M_str = (char *)((long)local_88._M_str + 8);
    local_88._M_len = local_88._M_len - 8;
    this->unit_type_signature_ = uVar2;
    uVar2 = CompilationUnitSizes::ReadDWARFOffset(this_00,&local_88);
    this->unit_type_offset_ = uVar2;
  }
switchD_001aa5b4_caseD_1:
  this_01 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&reader->abbrev_tables_,&local_78);
  this->unit_abbrev_ = this_01;
  if ((this_01->abbrev_)._M_h._M_element_count == 0) {
    uVar5 = (this->dwarf_->debug_abbrev)._M_len;
    data_00._M_len = uVar5 - local_78;
    if (uVar5 < local_78) {
      Throw("premature EOF reading variable-length DWARF data",0xad);
    }
    data_00._M_str = (this->dwarf_->debug_abbrev)._M_str + local_78;
    AbbrevTable::ReadAbbrevs(this_01,data_00);
  }
  (this->data_)._M_len = local_88._M_len;
  (this->data_)._M_str = local_88._M_str;
  ReadTopLevelDIE(this,reader);
  pCVar3 = reader->skeleton_;
  if ((pCVar3 == (CU *)0x0) || (pCVar3->dwo_id_ != this->dwo_id_)) {
    pCVar3 = this;
  }
  this->skeleton_ = pCVar3;
  return;
}

Assistant:

void CU::ReadHeader(string_view entire_unit, string_view data,
                    InfoReader::Section section, InfoReader& reader) {
  entire_unit_ = entire_unit;
  dwarf_ = &reader.dwarf_;
  dwo_id_ = 0;
  unit_sizes_.ReadDWARFVersion(&data);

  if (unit_sizes_.dwarf_version() > 5) {
    THROWF("Data is in DWARF $0 format which we don't understand",
           unit_sizes_.dwarf_version());
  }

  uint64_t debug_abbrev_offset;

  if (unit_sizes_.dwarf_version() == 5) {
    unit_type_ = ReadFixed<uint8_t>(&data);
    unit_sizes_.SetAddressSize(ReadFixed<uint8_t>(&data));
    debug_abbrev_offset = unit_sizes_.ReadDWARFOffset(&data);

    switch (unit_type_) {
      case DW_UT_skeleton:
      case DW_UT_split_compile:
      case DW_UT_split_type:
        dwo_id_ = ReadFixed<uint64_t>(&data);
        break;
      case DW_UT_type:
        unit_type_signature_ = ReadFixed<uint64_t>(&data);
        unit_type_offset_ = unit_sizes_.ReadDWARFOffset(&data);
        break;
      case DW_UT_compile:
      case DW_UT_partial:
        break;
      default:
        fprintf(stderr, "warning: Unknown DWARF Unit Type in user defined range\n");
        break;
    }

  } else {
    debug_abbrev_offset = unit_sizes_.ReadDWARFOffset(&data);
    unit_sizes_.SetAddressSize(ReadFixed<uint8_t>(&data));

    if (section == InfoReader::Section::kDebugTypes) {
      unit_type_signature_ = ReadFixed<uint64_t>(&data);
      unit_type_offset_ = unit_sizes_.ReadDWARFOffset(&data);
    }
  }

  unit_abbrev_ = &reader.abbrev_tables_[debug_abbrev_offset];

  // If we haven't already read abbreviations for this debug_abbrev_offset_, we
  // need to do so now.
  if (unit_abbrev_->IsEmpty()) {
    string_view abbrev_data = dwarf_->debug_abbrev;
    SkipBytes(debug_abbrev_offset, &abbrev_data);
    unit_abbrev_->ReadAbbrevs(abbrev_data);
  }

  data_ = data;
  ReadTopLevelDIE(reader);

  if (reader.skeleton_ && reader.skeleton_->dwo_id_ == dwo_id_) {
    skeleton_ = reader.skeleton_;
  } else {
    skeleton_ = this;
  }
}